

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_export.c
# Opt level: O3

REF_STATUS ref_export_by_extension(REF_GRID ref_grid,char *filename)

{
  char *__s1;
  REF_CELL_TYPE RVar1;
  REF_DBL *pRVar2;
  REF_CELL pRVar3;
  int iVar4;
  uint uVar5;
  REF_STATUS RVar6;
  size_t sVar7;
  void *pvVar8;
  void *pvVar9;
  REF_CELL *ppRVar10;
  FILE *pFVar11;
  REF_CELL *ppRVar12;
  long lVar13;
  undefined8 uVar14;
  int iVar15;
  char *pcVar16;
  long lVar17;
  uint uVar18;
  REF_INT RVar19;
  REF_NODE pRVar20;
  ulong uVar21;
  REF_INT *__ptr;
  uint uVar22;
  long lVar23;
  int iVar24;
  int iVar25;
  char *pcVar26;
  char *__s1_00;
  ulong uVar27;
  undefined4 uVar28;
  REF_INT *o2n;
  REF_INT nnode;
  REF_INT ncell;
  REF_INT *n2o;
  char temp_filename [28];
  REF_INT nodes [27];
  ulong local_500;
  long local_4f8;
  REF_INT *local_4f0;
  uint local_4e8;
  int local_4e4;
  FILE *local_4e0;
  REF_DICT local_4d8;
  void *local_4d0;
  REF_INT *local_4c8;
  int iStack_4c0;
  int iStack_4bc;
  int iStack_4b8;
  int iStack_4b4;
  int iStack_4b0;
  int local_4ac;
  REF_NODE local_450;
  REF_CELL *local_448;
  REF_CELL *local_440;
  undefined8 local_438;
  int iStack_430;
  int iStack_42c;
  int iStack_428;
  int iStack_424;
  int local_420;
  int local_41c;
  int local_418;
  int local_414;
  
  sVar7 = strlen(filename);
  pcVar16 = filename + (sVar7 - 4);
  iVar4 = strcmp(pcVar16,".vtk");
  if (iVar4 == 0) {
    pRVar20 = ref_grid->node;
    pFVar11 = fopen(filename,"w");
    if (pFVar11 == (FILE *)0x0) {
      printf("unable to open %s\n",filename);
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",0x9b
             ,"ref_export_vtk","unable to open file");
      uVar5 = 2;
    }
    else {
      fwrite("# vtk DataFile Version 2.0\n",0x1b,1,pFVar11);
      fwrite("ref_export_vtk\n",0xf,1,pFVar11);
      fwrite("ASCII\n",6,1,pFVar11);
      uVar5 = ref_node_compact(pRVar20,&local_4c8,&local_4f0);
      if (uVar5 == 0) {
        fwrite("DATASET UNSTRUCTURED_GRID\n",0x1a,1,pFVar11);
        pvVar8 = (void *)0x0;
        fprintf(pFVar11,"POINTS %d double\n",(ulong)(uint)pRVar20->n);
        if (0 < pRVar20->n) {
          lVar23 = 0;
          do {
            pRVar2 = pRVar20->real;
            lVar17 = (long)local_4f0[lVar23];
            fprintf(pFVar11," %.16e %.16e %.16e\n",pRVar2[lVar17 * 0xf],pRVar2[lVar17 * 0xf + 1],
                    pRVar2[lVar17 * 0xf + 2]);
            lVar23 = lVar23 + 1;
          } while (lVar23 < pRVar20->n);
        }
        ppRVar10 = ref_grid->cell + 3;
        lVar23 = 0;
        uVar27 = 0;
        do {
          iVar4 = ppRVar10[lVar23]->n;
          pvVar8 = (void *)(ulong)(uint)((int)pvVar8 + iVar4);
          uVar27 = (ulong)(uint)((int)uVar27 + (ppRVar10[lVar23]->node_per + 1) * iVar4);
          lVar23 = lVar23 + 1;
        } while (lVar23 != 0xd);
        local_4d0 = pvVar8;
        fprintf(pFVar11,"CELLS %d %d\n",pvVar8,uVar27);
        lVar23 = 3;
        local_448 = ppRVar10;
        do {
          pRVar3 = *ppRVar10;
          if (0 < pRVar3->max) {
            uVar5 = pRVar3->node_per;
            uVar27 = (ulong)uVar5;
            RVar19 = 0;
            do {
              RVar6 = ref_cell_nodes(pRVar3,RVar19,(REF_INT *)&local_438);
              if (RVar6 == 0) {
                fprintf(pFVar11," %d",uVar27);
                iVar4 = iStack_430;
                uVar28 = (undefined4)((ulong)local_438 >> 0x20);
                if (uVar27 == 6) {
                  local_438 = (REF_INT *)CONCAT44((int)local_438,uVar28);
                  iVar4 = iStack_42c;
LAB_0017499c:
                  iStack_42c = iStack_428;
                  iStack_428 = iVar4;
LAB_001749b0:
                  uVar21 = 0;
                  do {
                    fprintf(pFVar11," %d",
                            (ulong)(uint)local_4c8[*(int *)((long)&local_438 + uVar21 * 4)]);
                    uVar21 = uVar21 + 1;
                  } while (uVar27 != uVar21);
                }
                else {
                  if (uVar5 == 5) {
                    local_438 = (REF_INT *)CONCAT44((int)local_438,uVar28);
                    iStack_430 = iStack_42c;
                    goto LAB_0017499c;
                  }
                  if (0 < (int)uVar5) goto LAB_001749b0;
                }
                fputc(10,pFVar11);
              }
              RVar19 = RVar19 + 1;
            } while (RVar19 < pRVar3->max);
          }
          ppRVar10 = ref_grid->cell + lVar23 + 1;
          lVar23 = lVar23 + 1;
        } while (lVar23 != 0x10);
        fprintf(pFVar11,"CELL_TYPES %d\n",local_4d0);
        pRVar3 = *local_448;
        iVar4 = pRVar3->max;
        if (0 < iVar4) {
          iVar25 = 0;
          do {
            if (pRVar3->c2n[(long)iVar25 * (long)pRVar3->size_per] != -1) {
              fprintf(pFVar11," %d\n",5);
              iVar4 = pRVar3->max;
            }
            iVar25 = iVar25 + 1;
          } while (iVar25 < iVar4);
        }
        pRVar3 = ref_grid->cell[6];
        iVar4 = pRVar3->max;
        if (0 < iVar4) {
          iVar25 = 0;
          do {
            if (pRVar3->c2n[(long)iVar25 * (long)pRVar3->size_per] != -1) {
              fprintf(pFVar11," %d\n",9);
              iVar4 = pRVar3->max;
            }
            iVar25 = iVar25 + 1;
          } while (iVar25 < iVar4);
        }
        pRVar3 = ref_grid->cell[8];
        iVar4 = pRVar3->max;
        if (0 < iVar4) {
          iVar25 = 0;
          do {
            if (pRVar3->c2n[(long)iVar25 * (long)pRVar3->size_per] != -1) {
              fprintf(pFVar11," %d\n",10);
              iVar4 = pRVar3->max;
            }
            iVar25 = iVar25 + 1;
          } while (iVar25 < iVar4);
        }
        pRVar3 = ref_grid->cell[9];
        iVar4 = pRVar3->max;
        if (0 < iVar4) {
          iVar25 = 0;
          do {
            if (pRVar3->c2n[(long)iVar25 * (long)pRVar3->size_per] != -1) {
              fprintf(pFVar11," %d\n",0xe);
              iVar4 = pRVar3->max;
            }
            iVar25 = iVar25 + 1;
          } while (iVar25 < iVar4);
        }
        pRVar3 = ref_grid->cell[10];
        iVar4 = pRVar3->max;
        if (0 < iVar4) {
          iVar25 = 0;
          do {
            if (pRVar3->c2n[(long)iVar25 * (long)pRVar3->size_per] != -1) {
              fprintf(pFVar11," %d\n",0xd);
              iVar4 = pRVar3->max;
            }
            iVar25 = iVar25 + 1;
          } while (iVar25 < iVar4);
        }
        pRVar3 = ref_grid->cell[0xb];
        iVar4 = pRVar3->max;
        if (0 < iVar4) {
          iVar25 = 0;
          do {
            if (pRVar3->c2n[(long)iVar25 * (long)pRVar3->size_per] != -1) {
              fprintf(pFVar11," %d\n",0xc);
              iVar4 = pRVar3->max;
            }
            iVar25 = iVar25 + 1;
          } while (iVar25 < iVar4);
        }
        __ptr = local_4c8;
        if (local_4f0 != (REF_INT *)0x0) {
          free(local_4f0);
          __ptr = local_4c8;
        }
LAB_00174bf7:
        if (__ptr != (REF_INT *)0x0) {
          free(__ptr);
        }
LAB_00174c04:
        fclose(pFVar11);
        return 0;
      }
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",0xa1
             ,"ref_export_vtk",(ulong)uVar5,"compact");
    }
    pcVar16 = "vtk export failed";
    uVar14 = 0xaa0;
  }
  else {
    pcVar26 = filename + sVar7;
    if (((pcVar26[-2] == '.') && (pcVar26[-1] == 'c')) && (*pcVar26 == '\0')) {
      pRVar20 = ref_grid->node;
      pFVar11 = fopen(filename,"w");
      if (pFVar11 == (FILE *)0x0) {
        printf("unable to open %s\n",filename);
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
               0x6a1,"ref_export_c","unable to open file");
        uVar5 = 2;
      }
      else {
        uVar5 = ref_node_compact(pRVar20,&local_4c8,&local_4f0);
        if (uVar5 == 0) {
          if (0 < pRVar20->n) {
            uVar27 = 0;
            do {
              fprintf(pFVar11,"  RSS(ref_node_add(ref_node,%d,&node),\"node\");\n",
                      uVar27 & 0xffffffff);
              uVar21 = 0;
              do {
                fprintf(pFVar11,"  ref_node_xyz(ref_node,%d,node) = %.15e;\n",
                        pRVar20->real[(long)local_4f0[uVar27] * 0xf + uVar21],uVar21 & 0xffffffff);
                uVar21 = uVar21 + 1;
              } while ((int)uVar21 != 3);
              uVar27 = uVar27 + 1;
            } while ((long)uVar27 < (long)pRVar20->n);
          }
          pRVar3 = ref_grid->cell[6];
          if (0 < pRVar3->max) {
            RVar19 = 0;
            do {
              RVar6 = ref_cell_nodes(pRVar3,RVar19,(REF_INT *)&local_438);
              if (RVar6 == 0) {
                if (0 < pRVar3->size_per) {
                  uVar27 = 0;
                  do {
                    fprintf(pFVar11,"  nodes[%d] = %d;\n",uVar27 & 0xffffffff,
                            (ulong)(uint)local_4c8[*(int *)((long)&local_438 + uVar27 * 4)]);
                    uVar27 = uVar27 + 1;
                  } while ((long)uVar27 < (long)pRVar3->size_per);
                }
                fwrite("  RSS(ref_cell_add(ref_grid_qua(ref_grid),nodes,&cell),\"qua\");\n",0x3f,1,
                       pFVar11);
              }
              RVar19 = RVar19 + 1;
            } while (RVar19 < pRVar3->max);
          }
          if (local_4f0 != (REF_INT *)0x0) {
            free(local_4f0);
          }
          if (local_4c8 != (REF_INT *)0x0) {
            free(local_4c8);
          }
          goto LAB_00174c04;
        }
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
               0x6a3,"ref_export_c",(ulong)uVar5,"compact");
      }
      pcVar16 = "C export failed";
      uVar14 = 0xaa2;
      goto LAB_001751c3;
    }
    iVar4 = strcmp(pcVar16,".tec");
    if (iVar4 == 0) {
      pFVar11 = fopen(filename,"w");
      if (pFVar11 == (FILE *)0x0) {
        printf("unable to open %s\n",filename);
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
               0x2fa,"ref_export_tec","unable to open file");
        uVar5 = 2;
      }
      else {
        fwrite("title=\"tecplot refine geometry file\"\n",0x25,1,pFVar11);
        fwrite("variables = \"x\" \"y\" \"z\"\n",0x18,1,pFVar11);
        pRVar20 = ref_grid->node;
        local_440 = ref_grid->cell;
        ppRVar10 = ref_grid->cell + 8;
        ppRVar12 = (REF_CELL *)0x8;
        local_4e0 = pFVar11;
        local_450 = pRVar20;
        do {
          pRVar3 = *ppRVar10;
          if (0 < pRVar3->n) {
            uVar5 = pRVar20->max;
            if ((long)(int)uVar5 < 0) {
              pcVar16 = "malloc o2n of REF_INT negative";
              uVar14 = 0x2ac;
LAB_0017516b:
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                     ,uVar14,"ref_export_tec_vol_zone",pcVar16);
              uVar5 = 1;
            }
            else {
              uVar22 = pRVar3->node_per;
              sVar7 = (long)(int)uVar5 * 4;
              local_448 = ppRVar12;
              pvVar8 = malloc(sVar7);
              if (pvVar8 != (void *)0x0) {
                if (uVar5 != 0) {
                  memset(pvVar8,0xff,sVar7);
                }
                if (0 < pRVar3->max) {
                  iVar4 = 0;
                  RVar19 = 0;
                  do {
                    RVar6 = ref_cell_nodes(pRVar3,RVar19,(REF_INT *)&local_438);
                    if (RVar6 == 0 && 0 < (int)uVar22) {
                      uVar27 = 0;
                      do {
                        lVar23 = (long)*(int *)((long)&local_438 + uVar27 * 4);
                        if (*(int *)((long)pvVar8 + lVar23 * 4) == -1) {
                          *(int *)((long)pvVar8 + lVar23 * 4) = iVar4;
                          iVar4 = iVar4 + 1;
                        }
                        uVar27 = uVar27 + 1;
                      } while (uVar22 != uVar27);
                    }
                    RVar19 = RVar19 + 1;
                  } while (RVar19 < pRVar3->max);
                  uVar5 = local_450->max;
                }
                if ((int)uVar5 < 1) {
                  pvVar9 = malloc(0);
                  pFVar11 = local_4e0;
                  if (pvVar9 == (void *)0x0) {
LAB_00174f73:
                    pcVar16 = "malloc n2o of REF_INT NULL";
                    uVar14 = 0x2c3;
                    goto LAB_00174f94;
                  }
                  local_4d0 = pvVar9;
                  fprintf(local_4e0,
                          "zone t=\"e%d\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
                          (ulong)uVar22,0,(ulong)(uint)pRVar3->n,"point","febrick");
                  pRVar20 = local_450;
                }
                else {
                  uVar27 = 0;
                  uVar18 = 0;
                  do {
                    if (*(int *)((long)pvVar8 + uVar27 * 4) != -1) {
                      *(uint *)((long)pvVar8 + uVar27 * 4) = uVar18;
                      uVar18 = uVar18 + 1;
                    }
                    uVar27 = uVar27 + 1;
                  } while (uVar5 != uVar27);
                  if ((int)uVar18 < 0) {
                    pcVar16 = "malloc n2o of REF_INT negative";
                    uVar14 = 0x2c3;
                    goto LAB_0017516b;
                  }
                  pvVar9 = malloc((ulong)uVar18 * 4);
                  if (pvVar9 == (void *)0x0) goto LAB_00174f73;
                  uVar27 = 0;
                  do {
                    lVar23 = (long)*(int *)((long)pvVar8 + uVar27 * 4);
                    if (lVar23 != -1) {
                      *(int *)((long)pvVar9 + lVar23 * 4) = (int)uVar27;
                    }
                    uVar27 = uVar27 + 1;
                  } while (uVar5 != uVar27);
                  local_4d0 = pvVar9;
                  fprintf(local_4e0,
                          "zone t=\"e%d\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
                          (ulong)uVar22,(ulong)uVar18,(ulong)(uint)pRVar3->n,"point","febrick");
                  pRVar20 = local_450;
                  pvVar9 = local_4d0;
                  pFVar11 = local_4e0;
                  if (uVar18 != 0) {
                    uVar27 = 0;
                    do {
                      pRVar2 = pRVar20->real;
                      lVar23 = (long)*(int *)((long)pvVar9 + uVar27 * 4);
                      fprintf(pFVar11," %.16e %.16e %.16e\n",pRVar2[lVar23 * 0xf],
                              pRVar2[lVar23 * 0xf + 1],pRVar2[lVar23 * 0xf + 2]);
                      uVar27 = uVar27 + 1;
                    } while (uVar18 != uVar27);
                  }
                }
                if (0 < pRVar3->max) {
                  RVar19 = 0;
                  do {
                    RVar6 = ref_cell_nodes(pRVar3,RVar19,(REF_INT *)&local_438);
                    if (RVar6 != 0) goto LAB_001746ee;
                    switch(pRVar3->node_per) {
                    case 4:
                      iStack_4c0 = iStack_430;
                      iStack_4bc = iStack_430;
                      iStack_4b8 = iStack_42c;
                      iStack_4b4 = iStack_42c;
                      local_4ac = iStack_42c;
                      goto LAB_001746b1;
                    case 5:
                      iStack_4c0 = iStack_430;
                      iStack_4bc = iStack_430;
                      iStack_4b8 = iStack_42c;
                      iStack_4b4 = iStack_428;
                      iStack_4b0 = iStack_428;
                      local_4ac = iStack_42c;
                      break;
                    case 6:
                      iStack_4c0 = iStack_430;
                      iStack_4bc = iStack_430;
                      iStack_4b4 = iStack_428;
                      local_4ac = iStack_424;
LAB_001746b1:
                      iStack_4b8 = iStack_42c;
                      iStack_4c0 = iStack_430;
                      iStack_4b0 = local_4ac;
                      iStack_4bc = iStack_4c0;
                      break;
                    default:
                      uVar5 = 6;
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                             ,0x2e2,"ref_export_tec_vol_zone",6,"wrong nodes per cell");
                      goto LAB_00175177;
                    case 8:
                      local_4c8 = local_438;
                      iStack_4bc = iStack_42c;
                      iStack_4b8 = iStack_428;
                      iStack_4b4 = iStack_424;
                      iStack_4b0 = local_420;
                      local_4ac = local_41c;
                    }
                    local_4c8 = local_438;
                    iStack_4c0 = iStack_430;
                    lVar23 = 0;
                    do {
                      fprintf(pFVar11," %d",
                              (ulong)(*(int *)((long)pvVar8 +
                                              (long)*(int *)((long)&local_4c8 + lVar23 * 4) * 4) + 1
                                     ));
                      lVar23 = lVar23 + 1;
                    } while (lVar23 != 8);
                    fputc(10,pFVar11);
LAB_001746ee:
                    RVar19 = RVar19 + 1;
                  } while (RVar19 < pRVar3->max);
                }
                free(local_4d0);
                free(pvVar8);
                ppRVar12 = local_448;
                goto LAB_00174715;
              }
              pcVar16 = "malloc o2n of REF_INT NULL";
              uVar14 = 0x2ac;
LAB_00174f94:
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                     ,uVar14,"ref_export_tec_vol_zone",pcVar16);
              uVar5 = 2;
            }
LAB_00175177:
            pcVar16 = "vol";
            uVar14 = 0x2ff;
            goto LAB_00175198;
          }
LAB_00174715:
          ppRVar10 = local_440 + (long)((long)ppRVar12 + 1);
          ppRVar12 = (REF_CELL *)((long)ppRVar12 + 1);
        } while (ppRVar12 != (REF_CELL *)0x10);
        uVar5 = ref_export_tec_surf_zone(ref_grid,(FILE *)pFVar11);
        if (uVar5 == 0) {
          pRVar20 = ref_grid->node;
          uVar5 = ref_dict_create(&local_4d8);
          if (uVar5 == 0) {
            pRVar3 = ref_grid->cell[4];
            if (0 < pRVar3->max) {
              iVar4 = 0;
              do {
                RVar6 = ref_cell_nodes(pRVar3,iVar4,(REF_INT *)&local_438);
                if ((RVar6 == 0) &&
                   (uVar5 = ref_dict_store(local_4d8,
                                           *(REF_INT *)
                                            ((long)&local_438 + (long)pRVar3->node_per * 4),-1),
                   uVar5 != 0)) {
                  pcVar16 = "mark tri";
                  uVar14 = 0x1e3;
                  goto LAB_00175c0f;
                }
                iVar4 = iVar4 + 1;
              } while (iVar4 < pRVar3->max);
            }
            if (local_4d8->n < 1) {
LAB_00175b38:
              uVar5 = ref_dict_free(local_4d8);
              if (uVar5 == 0) {
                pRVar20 = ref_grid->node;
                uVar5 = ref_dict_create(&local_4d8);
                if (uVar5 == 0) {
                  pRVar3 = ref_grid->cell[5];
                  if (0 < pRVar3->max) {
                    iVar4 = 0;
                    do {
                      RVar6 = ref_cell_nodes(pRVar3,iVar4,(REF_INT *)&local_438);
                      if ((RVar6 == 0) &&
                         (uVar5 = ref_dict_store(local_4d8,
                                                 *(REF_INT *)
                                                  ((long)&local_438 + (long)pRVar3->node_per * 4),-1
                                                ), uVar5 != 0)) {
                        pcVar16 = "mark tri";
                        uVar14 = 0x21f;
                        goto LAB_0017665e;
                      }
                      iVar4 = iVar4 + 1;
                    } while (iVar4 < pRVar3->max);
                  }
                  if (local_4d8->n < 1) {
LAB_0017658c:
                    uVar5 = ref_dict_free(local_4d8);
                    if (uVar5 == 0) {
                      uVar5 = ref_export_tec_edg_zone(ref_grid,(FILE *)local_4e0);
                      if (uVar5 == 0) {
                        uVar5 = ref_export_tec_ed2_zone(ref_grid,(FILE *)local_4e0);
                        if (uVar5 == 0) {
                          uVar5 = ref_export_tec_ed3_zone(ref_grid,(FILE *)local_4e0);
                          pFVar11 = local_4e0;
                          if (uVar5 == 0) goto LAB_00174c04;
                          pcVar16 = "ed3";
                          uVar14 = 0x305;
                        }
                        else {
                          pcVar16 = "ed2";
                          uVar14 = 0x304;
                        }
                      }
                      else {
                        pcVar16 = "edg";
                        uVar14 = 0x303;
                      }
                      goto LAB_00175198;
                    }
                    pcVar16 = "free dict";
                    uVar14 = 0x24f;
                  }
                  else {
                    uVar22 = *local_4d8->key;
                    uVar5 = ref_grid_cell_id_nodes
                                      (ref_grid,pRVar3,uVar22,(REF_INT *)&local_4e8,&local_4e4,
                                       &local_4c8,&local_4f0);
                    if (uVar5 == 0) {
                      local_4f8 = 0;
                      do {
                        pFVar11 = local_4e0;
                        fprintf(local_4e0,
                                "zone t=\"p3face%d\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n"
                                ,(ulong)uVar22,(ulong)local_4e8,(ulong)(uint)(local_4e4 * 9),"point"
                                ,"fetriangle");
                        if (0 < (int)local_4e8) {
                          lVar23 = 0;
                          do {
                            pRVar2 = pRVar20->real;
                            lVar17 = (long)local_4f0[lVar23];
                            fprintf(pFVar11," %.16e %.16e %.16e\n",pRVar2[lVar17 * 0xf],
                                    pRVar2[lVar17 * 0xf + 1],pRVar2[lVar17 * 0xf + 2]);
                            lVar23 = lVar23 + 1;
                          } while (lVar23 < (int)local_4e8);
                        }
                        if (0 < pRVar3->max) {
                          RVar19 = 0;
                          do {
                            RVar6 = ref_cell_nodes(pRVar3,RVar19,(REF_INT *)&local_438);
                            pFVar11 = local_4e0;
                            if ((RVar6 == 0) &&
                               (uVar22 == *(uint *)((long)&local_438 + (long)pRVar3->node_per * 4)))
                            {
                              fprintf(local_4e0," %d %d %d\n",(ulong)(local_4c8[(int)local_438] + 1)
                                      ,(ulong)(local_4c8[iStack_42c] + 1),
                                      (ulong)(local_4c8[local_418] + 1));
                              fprintf(pFVar11," %d %d %d\n",(ulong)(local_4c8[local_418] + 1),
                                      (ulong)(local_4c8[iStack_42c] + 1),
                                      (ulong)(local_4c8[local_414] + 1));
                              fprintf(pFVar11," %d %d %d\n",(ulong)(local_4c8[local_438._4_4_] + 1),
                                      (ulong)(local_4c8[iStack_424] + 1),
                                      (ulong)(local_4c8[iStack_428] + 1));
                              fprintf(pFVar11," %d %d %d\n",(ulong)(local_4c8[iStack_428] + 1),
                                      (ulong)(local_4c8[iStack_424] + 1),
                                      (ulong)(local_4c8[local_414] + 1));
                              fprintf(pFVar11," %d %d %d\n",(ulong)(local_4c8[iStack_430] + 1),
                                      (ulong)(local_4c8[local_41c] + 1),
                                      (ulong)(local_4c8[local_420] + 1));
                              fprintf(pFVar11," %d %d %d\n",(ulong)(local_4c8[local_420] + 1),
                                      (ulong)(local_4c8[local_41c] + 1),
                                      (ulong)(local_4c8[local_414] + 1));
                              fprintf(pFVar11," %d %d %d\n",(ulong)(local_4c8[local_414] + 1),
                                      (ulong)(local_4c8[iStack_424] + 1),
                                      (ulong)(local_4c8[local_420] + 1));
                              fprintf(pFVar11," %d %d %d\n",(ulong)(local_4c8[local_414] + 1),
                                      (ulong)(local_4c8[local_41c] + 1),
                                      (ulong)(local_4c8[local_418] + 1));
                              fprintf(pFVar11," %d %d %d\n",(ulong)(local_4c8[local_414] + 1),
                                      (ulong)(local_4c8[iStack_42c] + 1),
                                      (ulong)(local_4c8[iStack_428] + 1));
                            }
                            RVar19 = RVar19 + 1;
                          } while (RVar19 < pRVar3->max);
                        }
                        if (local_4f0 != (REF_INT *)0x0) {
                          free(local_4f0);
                        }
                        if (local_4c8 != (REF_INT *)0x0) {
                          free(local_4c8);
                        }
                        local_4f8 = local_4f8 + 1;
                        if (local_4d8->n <= local_4f8) goto LAB_0017658c;
                        uVar22 = local_4d8->key[local_4f8];
                        uVar5 = ref_grid_cell_id_nodes
                                          (ref_grid,pRVar3,uVar22,(REF_INT *)&local_4e8,&local_4e4,
                                           &local_4c8,&local_4f0);
                      } while (uVar5 == 0);
                    }
                    pcVar16 = "extract this tri";
                    uVar14 = 0x224;
                  }
                }
                else {
                  pcVar16 = "create dict";
                  uVar14 = 0x21a;
                }
LAB_0017665e:
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                       ,uVar14,"ref_export_tec_tr3_zone",(ulong)uVar5,pcVar16);
                pcVar16 = "tr3";
                uVar14 = 0x302;
                goto LAB_00175198;
              }
              pcVar16 = "free dict";
              uVar14 = 0x206;
            }
            else {
              uVar22 = *local_4d8->key;
              uVar5 = ref_grid_cell_id_nodes
                                (ref_grid,pRVar3,uVar22,(REF_INT *)&local_4e8,&local_4e4,&local_4c8,
                                 &local_4f0);
              if (uVar5 == 0) {
                lVar23 = 0;
                do {
                  pFVar11 = local_4e0;
                  fprintf(local_4e0,
                          "zone t=\"p2face%d\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n"
                          ,(ulong)uVar22,(ulong)local_4e8,(ulong)(uint)(local_4e4 << 2),"point",
                          "fetriangle");
                  if (0 < (int)local_4e8) {
                    lVar17 = 0;
                    do {
                      pRVar2 = pRVar20->real;
                      lVar13 = (long)local_4f0[lVar17];
                      fprintf(pFVar11," %.16e %.16e %.16e\n",pRVar2[lVar13 * 0xf],
                              pRVar2[lVar13 * 0xf + 1],pRVar2[lVar13 * 0xf + 2]);
                      lVar17 = lVar17 + 1;
                    } while (lVar17 < (int)local_4e8);
                  }
                  if (0 < pRVar3->max) {
                    RVar19 = 0;
                    do {
                      RVar6 = ref_cell_nodes(pRVar3,RVar19,(REF_INT *)&local_438);
                      pFVar11 = local_4e0;
                      if ((RVar6 == 0) &&
                         (uVar22 == *(uint *)((long)&local_438 + (long)pRVar3->node_per * 4))) {
                        fprintf(local_4e0," %d %d %d\n",(ulong)(local_4c8[(int)local_438] + 1),
                                (ulong)(local_4c8[iStack_42c] + 1),
                                (ulong)(local_4c8[iStack_424] + 1));
                        fprintf(pFVar11," %d %d %d\n",(ulong)(local_4c8[local_438._4_4_] + 1),
                                (ulong)(local_4c8[iStack_428] + 1),
                                (ulong)(local_4c8[iStack_42c] + 1));
                        fprintf(pFVar11," %d %d %d\n",(ulong)(local_4c8[iStack_430] + 1),
                                (ulong)(local_4c8[iStack_424] + 1),
                                (ulong)(local_4c8[iStack_428] + 1));
                        fprintf(pFVar11," %d %d %d\n",(ulong)(local_4c8[iStack_42c] + 1),
                                (ulong)(local_4c8[iStack_428] + 1),
                                (ulong)(local_4c8[iStack_424] + 1));
                      }
                      RVar19 = RVar19 + 1;
                    } while (RVar19 < pRVar3->max);
                  }
                  if (local_4f0 != (REF_INT *)0x0) {
                    free(local_4f0);
                  }
                  if (local_4c8 != (REF_INT *)0x0) {
                    free(local_4c8);
                  }
                  lVar23 = lVar23 + 1;
                  if (local_4d8->n <= lVar23) goto LAB_00175b38;
                  uVar22 = local_4d8->key[lVar23];
                  uVar5 = ref_grid_cell_id_nodes
                                    (ref_grid,pRVar3,uVar22,(REF_INT *)&local_4e8,&local_4e4,
                                     &local_4c8,&local_4f0);
                } while (uVar5 == 0);
              }
              pcVar16 = "extract this tri";
              uVar14 = 0x1e8;
            }
          }
          else {
            pcVar16 = "create dict";
            uVar14 = 0x1de;
          }
LAB_00175c0f:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
                 uVar14,"ref_export_tec_tr2_zone",(ulong)uVar5,pcVar16);
          pcVar16 = "tr2";
          uVar14 = 0x301;
        }
        else {
          pcVar16 = "surf";
          uVar14 = 0x300;
        }
LAB_00175198:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
               uVar14,"ref_export_tec",(ulong)uVar5,pcVar16);
      }
      pcVar16 = "tec export failed";
      uVar14 = 0xaa4;
      goto LAB_001751c3;
    }
    iVar4 = strcmp(pcVar16,".plt");
    if (iVar4 == 0) {
      uVar5 = ref_gather_by_extension(ref_grid,filename);
      if (uVar5 == 0) {
        return 0;
      }
      pcVar16 = "plt gather failed";
      uVar14 = 0xaa6;
      goto LAB_001751c3;
    }
    iVar4 = strcmp(pcVar16,".eps");
    if (iVar4 == 0) {
      uVar5 = ref_export_eps(ref_grid,filename);
      if (uVar5 == 0) {
        return 0;
      }
      pcVar16 = "eps export failed";
      uVar14 = 0xaa8;
      goto LAB_001751c3;
    }
    iVar4 = strcmp(pcVar16,".pdf");
    if (iVar4 == 0) {
      iStack_4b8 = 0x5f726f66;
      iStack_4b4 = 0x2e666470;
      iStack_4b0 = 0x737065;
      local_4c8 = (REF_INT *)0x6f7078655f666572;
      iStack_4c0 = 0x745f7472;
      iStack_4bc = 0x5f706d65;
      uVar5 = ref_export_eps(ref_grid,(char *)&local_4c8);
      if (uVar5 == 0) {
        snprintf((char *)&local_438,0x400,"epstopdf %s -o=%s",&local_4c8,filename);
        iVar4 = system((char *)&local_438);
        if (iVar4 == 0) {
          iVar4 = remove((char *)&local_4c8);
          if (iVar4 == 0) {
            return 0;
          }
          pcVar16 = "temp clean up";
          uVar14 = 0x6f9;
        }
        else {
          pcVar16 = "epstopdf failed";
          uVar14 = 0x6f8;
        }
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
               uVar14,"ref_export_pdf",pcVar16,0,(long)iVar4);
        uVar5 = 1;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
               0x6f6,"ref_export_pdf",(ulong)uVar5,"temp eps");
      }
      pcVar16 = "pdf export failed";
      uVar14 = 0xaaa;
      goto LAB_001751c3;
    }
    iVar4 = strcmp(pcVar16,".su2");
    if (iVar4 != 0) {
      iVar4 = strcmp(pcVar26 + -10,".lb8.ugrid");
      if (iVar4 == 0) {
        uVar5 = ref_export_bin_ugrid(ref_grid,filename,0,0);
        if (uVar5 == 0) {
          return 0;
        }
        pcVar16 = "lb8.ugrid export failed";
        uVar14 = 0xaaf;
      }
      else {
        iVar4 = strcmp(pcVar26 + -9,".b8.ugrid");
        if (iVar4 == 0) {
          uVar5 = ref_export_bin_ugrid(ref_grid,filename,1,0);
          if (uVar5 == 0) {
            return 0;
          }
          pcVar16 = "b8.ugrid export failed";
          uVar14 = 0xab2;
        }
        else {
          iVar4 = strcmp(pcVar26 + -0xb,".lb8l.ugrid");
          if (iVar4 != 0) {
            iVar4 = strcmp(pcVar26 + -10,".b8l.ugrid");
            if (iVar4 == 0) {
              uVar5 = ref_export_bin_ugrid(ref_grid,filename,1,1);
              if (uVar5 == 0) {
                return 0;
              }
              pcVar16 = "b8l.ugrid export failed";
              uVar14 = 0xab8;
            }
            else {
              iVar4 = strcmp(pcVar26 + -0xc,".lb8.ugrid64");
              if (iVar4 == 0) {
                uVar5 = ref_export_bin_ugrid(ref_grid,filename,0,1);
                if (uVar5 == 0) {
                  return 0;
                }
                pcVar16 = "lb8.ugrid64 export failed";
                uVar14 = 0xabb;
                goto LAB_001756df;
              }
              iVar4 = strcmp(pcVar26 + -0xb,".b8.ugrid64");
              if (iVar4 == 0) {
                uVar5 = ref_export_bin_ugrid(ref_grid,filename,1,1);
                if (uVar5 == 0) {
                  return 0;
                }
                pcVar16 = "b8.ugrid64 export failed";
                uVar14 = 0xabe;
              }
              else {
                __s1 = pcVar26 + -6;
                iVar4 = strcmp(__s1,".ugrid");
                if (iVar4 == 0) {
                  uVar5 = ref_export_ugrid(ref_grid,filename);
                  if (uVar5 == 0) {
                    return 0;
                  }
                  pcVar16 = "ugrid export failed";
                  uVar14 = 0xac0;
                }
                else {
                  __s1_00 = pcVar26 + -5;
                  iVar4 = strcmp(__s1_00,".grid");
                  if (iVar4 == 0) {
                    uVar5 = ref_export_i_like_cfd_grid(ref_grid,filename);
                    if (uVar5 == 0) {
                      return 0;
                    }
                    pcVar16 = "grid export failed";
                    uVar14 = 0xac2;
                  }
                  else {
                    iVar4 = strcmp(__s1_00,".poly");
                    if (iVar4 == 0) {
                      uVar5 = ref_export_poly(ref_grid,filename);
                      if (uVar5 == 0) {
                        return 0;
                      }
                      pcVar16 = "poly export failed";
                      uVar14 = 0xac4;
                    }
                    else {
                      iVar4 = strcmp(__s1,".smesh");
                      if (iVar4 == 0) {
                        uVar5 = ref_export_smesh(ref_grid,filename);
                        if (uVar5 == 0) {
                          return 0;
                        }
                        pcVar16 = "smesh export failed";
                        uVar14 = 0xac6;
                      }
                      else {
                        iVar4 = strcmp(__s1,".fgrid");
                        if (iVar4 == 0) {
                          uVar5 = ref_export_fgrid(ref_grid,filename);
                          if (uVar5 == 0) {
                            return 0;
                          }
                          pcVar16 = "fgrid export failed";
                          uVar14 = 0xac8;
                        }
                        else {
                          iVar4 = strcmp(__s1_00,".html");
                          if (iVar4 == 0) {
                            uVar5 = ref_export_html(ref_grid,filename);
                            if (uVar5 == 0) {
                              return 0;
                            }
                            pcVar16 = "html export failed";
                            uVar14 = 0xaca;
                          }
                          else {
                            iVar4 = strcmp(__s1,".meshb");
                            if (iVar4 == 0) {
                              uVar5 = ref_export_meshb(ref_grid,filename);
                              if (uVar5 == 0) {
                                return 0;
                              }
                              pcVar16 = "meshb export failed";
                              uVar14 = 0xacc;
                            }
                            else {
                              iVar4 = strcmp(pcVar26 + -9,"-bamg.msh");
                              if (iVar4 == 0) {
                                uVar5 = ref_export_bamg_msh(ref_grid,filename);
                                if (uVar5 == 0) {
                                  return 0;
                                }
                                pcVar16 = "bamg msh export failed";
                                uVar14 = 0xace;
                              }
                              else {
                                iVar4 = strcmp(pcVar16,".msh");
                                if (iVar4 == 0) {
                                  uVar5 = ref_export_msh(ref_grid,filename);
                                  if (uVar5 == 0) {
                                    return 0;
                                  }
                                  pcVar16 = "msh export failed";
                                  uVar14 = 0xad0;
                                }
                                else {
                                  iVar4 = strcmp(__s1_00,".msh2");
                                  if (iVar4 == 0) {
                                    uVar5 = ref_export_msh2(ref_grid,filename);
                                    if (uVar5 == 0) {
                                      return 0;
                                    }
                                    pcVar16 = "msh2 export failed";
                                    uVar14 = 0xad2;
                                  }
                                  else {
                                    iVar4 = strcmp(pcVar16,".tri");
                                    if (iVar4 == 0) {
                                      uVar5 = ref_export_tri((REF_GRID)ref_grid->node,
                                                             (char *)ref_grid->cell[3]);
                                      if (uVar5 == 0) {
                                        return 0;
                                      }
                                      pcVar16 = "tri export failed";
                                      uVar14 = 0xad4;
                                    }
                                    else {
                                      uVar5 = ref_gather_by_extension(ref_grid,filename);
                                      if (uVar5 == 0) {
                                        return 0;
                                      }
                                      pcVar16 = "export via gather";
                                      uVar14 = 0xad6;
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
            goto LAB_001751c3;
          }
          uVar5 = ref_export_bin_ugrid(ref_grid,filename,0,1);
          if (uVar5 == 0) {
            return 0;
          }
          pcVar16 = "lb8l.ugrid export failed";
          uVar14 = 0xab5;
        }
      }
LAB_001756df:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
             uVar14,"ref_export_by_extension",(ulong)uVar5,pcVar16);
      return uVar5;
    }
    pRVar20 = ref_grid->node;
    pFVar11 = fopen(filename,"w");
    if (pFVar11 == (FILE *)0x0) {
      printf("unable to open %s\n",filename);
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
             0x4da,"ref_export_su2","unable to open file");
      uVar5 = 2;
    }
    else {
      pcVar16 = "NDIME= 2\n";
      if (ref_grid->twod == 0) {
        pcVar16 = "NDIME= 3\n";
      }
      fwrite(pcVar16,9,1,pFVar11);
      uVar5 = ref_node_compact(pRVar20,&local_4f0,(REF_INT **)&local_4d8);
      if (uVar5 == 0) {
        fprintf(pFVar11,"NPOIN= %d\n",(ulong)(uint)pRVar20->n);
        if (ref_grid->twod == 0) {
          if (0 < pRVar20->n) {
            lVar23 = 0;
            do {
              pRVar2 = pRVar20->real;
              lVar17 = (long)(&local_4d8->n)[lVar23];
              fprintf(pFVar11," %.16e %.16e %.16e\n",pRVar2[lVar17 * 0xf],pRVar2[lVar17 * 0xf + 1],
                      pRVar2[lVar17 * 0xf + 2]);
              lVar23 = lVar23 + 1;
            } while (lVar23 < pRVar20->n);
            goto LAB_0017573f;
          }
LAB_00175873:
          ppRVar10 = ref_grid->cell + 8;
          fprintf(pFVar11,"NELEM= %d\n",
                  (ulong)(uint)(ref_grid->cell[9]->n + ref_grid->cell[8]->n + ref_grid->cell[10]->n
                               + ref_grid->cell[0xb]->n));
          lVar23 = 8;
          do {
            pRVar3 = *ppRVar10;
            if (0 < pRVar3->max) {
              RVar19 = 0;
              do {
                RVar6 = ref_cell_nodes(pRVar3,RVar19,(REF_INT *)&local_4c8);
                if (RVar6 != 0) goto LAB_001759f0;
                switch(pRVar3->type) {
                case REF_CELL_EDG:
                case REF_CELL_ED2:
                case REF_CELL_ED3:
                case REF_CELL_TRI:
                case REF_CELL_TR2:
                case REF_CELL_TR3:
                case REF_CELL_QUA:
                case REF_CELL_QU2:
                case REF_CELL_TE2:
                case REF_CELL_PY2:
                case REF_CELL_PR2:
                case REF_CELL_HE2:
                  pcVar16 = "3D SU2 element";
                  uVar14 = 0x53d;
                  goto LAB_00175abe;
                case REF_CELL_TET:
                  pcVar16 = "10";
                  goto LAB_00175931;
                case REF_CELL_PYR:
                  fwrite("14",2,1,pFVar11);
                  iVar4 = iStack_4c0;
                  local_4c8 = (REF_INT *)CONCAT44((int)local_4c8,(int)((ulong)local_4c8 >> 0x20));
                  iStack_4c0 = iStack_4bc;
                  iStack_4bc = iStack_4b8;
                  iStack_4b8 = iVar4;
                  break;
                case REF_CELL_PRI:
                  fwrite("13",2,1,pFVar11);
                  iVar4 = iStack_4bc;
                  local_4c8 = (REF_INT *)CONCAT44((int)local_4c8,(int)((ulong)local_4c8 >> 0x20));
                  iStack_4bc = iStack_4b8;
                  iStack_4b8 = iVar4;
                  break;
                case REF_CELL_HEX:
                  pcVar16 = "12";
LAB_00175931:
                  fwrite(pcVar16,2,1,pFVar11);
                }
                if (0 < pRVar3->node_per) {
                  lVar17 = 0;
                  do {
                    fprintf(pFVar11," %d",
                            (ulong)(uint)local_4f0[*(int *)((long)&local_4c8 + lVar17 * 4)]);
                    lVar17 = lVar17 + 1;
                  } while (lVar17 < pRVar3->node_per);
                }
                fputc(10,pFVar11);
LAB_001759f0:
                RVar19 = RVar19 + 1;
              } while (RVar19 < pRVar3->max);
            }
            ppRVar10 = ref_grid->cell + lVar23 + 1;
            lVar23 = lVar23 + 1;
          } while (lVar23 != 0x10);
        }
        else {
          if (0 < pRVar20->n) {
            lVar23 = 0;
            do {
              fprintf(pFVar11," %.16e %.16e\n",pRVar20->real[(long)(&local_4d8->n)[lVar23] * 0xf],
                      pRVar20->real[(long)(&local_4d8->n)[lVar23] * 0xf + 1]);
              lVar23 = lVar23 + 1;
            } while (lVar23 < pRVar20->n);
LAB_0017573f:
            if (ref_grid->twod == 0) goto LAB_00175873;
          }
          ppRVar10 = ref_grid->cell + 3;
          fprintf(pFVar11,"NELEM= %d\n",(ulong)(uint)(ref_grid->cell[6]->n + ref_grid->cell[3]->n));
          lVar23 = 3;
          do {
            pRVar3 = *ppRVar10;
            if (0 < pRVar3->max) {
              RVar19 = 0;
LAB_001757a4:
              RVar6 = ref_cell_nodes(pRVar3,RVar19,(REF_INT *)&local_4c8);
              if (RVar6 != 0) goto LAB_00175818;
              RVar1 = pRVar3->type;
              if (REF_CELL_HE2 < RVar1) {
LAB_001757da:
                if (0 < pRVar3->node_per) {
                  lVar17 = 0;
                  do {
                    fprintf(pFVar11," %d",
                            (ulong)(uint)local_4f0[*(int *)((long)&local_4c8 + lVar17 * 4)]);
                    lVar17 = lVar17 + 1;
                  } while (lVar17 < pRVar3->node_per);
                }
                fputc(10,pFVar11);
                goto LAB_00175818;
              }
              iVar4 = 0x35;
              if (RVar1 == REF_CELL_TRI) {
LAB_001757d2:
                fputc(iVar4,pFVar11);
                goto LAB_001757da;
              }
              if (RVar1 == REF_CELL_QUA) {
                iVar4 = 0x39;
                goto LAB_001757d2;
              }
              pcVar16 = "2D SU2 element";
              uVar14 = 0x510;
LAB_00175abe:
              uVar5 = 6;
              uVar27 = 6;
              goto LAB_00175ac4;
            }
LAB_00175821:
            ppRVar10 = ref_grid->cell + lVar23 + 1;
            lVar23 = lVar23 + 1;
          } while (lVar23 != 8);
        }
        if (ref_grid->twod == 0) {
          ref_export_faceid_range(ref_grid,(REF_INT *)&local_438,&local_4e4);
          iVar4 = (int)local_438;
          local_500 = (ulong)local_438 & 0xffffffff;
          fprintf(pFVar11,"NMARK= %d\n",(ulong)((local_4e4 - (int)local_438) + 1));
          local_4d0 = (void *)CONCAT44(local_4d0._4_4_,local_4e4);
          if (iVar4 <= local_4e4) {
            do {
              pRVar3 = ref_grid->cell[3];
              iVar25 = 0;
              iVar4 = (int)local_500;
              if (0 < pRVar3->max) {
                iVar15 = pRVar3->node_per;
                iVar25 = 0;
                iVar24 = 0;
                do {
                  RVar6 = ref_cell_nodes(pRVar3,iVar24,(REF_INT *)&local_4c8);
                  if (RVar6 == 0) {
                    iVar25 = iVar25 + (uint)(*(int *)((long)&local_4c8 + (long)iVar15 * 4) == iVar4)
                    ;
                  }
                  iVar24 = iVar24 + 1;
                } while (iVar24 < pRVar3->max);
              }
              pRVar3 = ref_grid->cell[6];
              if (pRVar3->max < 1) {
                iVar15 = 0;
              }
              else {
                iVar24 = pRVar3->node_per;
                iVar15 = 0;
                RVar19 = 0;
                do {
                  RVar6 = ref_cell_nodes(pRVar3,RVar19,(REF_INT *)&local_4c8);
                  if (RVar6 == 0) {
                    iVar15 = iVar15 + (uint)(*(int *)((long)&local_4c8 + (long)iVar24 * 4) == iVar4)
                    ;
                  }
                  RVar19 = RVar19 + 1;
                } while (RVar19 < pRVar3->max);
              }
              fprintf(pFVar11,"MARKER_TAG= %d\n",local_500);
              fprintf(pFVar11,"MARKER_ELEMS= %d\n",(ulong)(uint)(iVar15 + iVar25));
              pRVar3 = ref_grid->cell[3];
              if (0 < pRVar3->max) {
                uVar5 = pRVar3->node_per;
                RVar19 = 0;
                do {
                  RVar6 = ref_cell_nodes(pRVar3,RVar19,(REF_INT *)&local_4c8);
                  if ((RVar6 == 0) && (*(int *)((long)&local_4c8 + (long)(int)uVar5 * 4) == iVar4))
                  {
                    fputc(0x35,pFVar11);
                    if (0 < (int)uVar5) {
                      uVar27 = 0;
                      do {
                        fprintf(pFVar11," %d",
                                (ulong)(uint)local_4f0[*(int *)((long)&local_4c8 + uVar27 * 4)]);
                        uVar27 = uVar27 + 1;
                      } while (uVar5 != uVar27);
                    }
                    fputc(10,pFVar11);
                  }
                  RVar19 = RVar19 + 1;
                } while (RVar19 < pRVar3->max);
              }
              pRVar3 = ref_grid->cell[6];
              if (0 < pRVar3->max) {
                uVar5 = pRVar3->node_per;
                RVar19 = 0;
                do {
                  RVar6 = ref_cell_nodes(pRVar3,RVar19,(REF_INT *)&local_4c8);
                  if ((RVar6 == 0) && (*(int *)((long)&local_4c8 + (long)(int)uVar5 * 4) == iVar4))
                  {
                    fputc(0x39,pFVar11);
                    if (0 < (int)uVar5) {
                      uVar27 = 0;
                      do {
                        fprintf(pFVar11," %d",
                                (ulong)(uint)local_4f0[*(int *)((long)&local_4c8 + uVar27 * 4)]);
                        uVar27 = uVar27 + 1;
                      } while (uVar5 != uVar27);
                    }
                    fputc(10,pFVar11);
                  }
                  RVar19 = RVar19 + 1;
                } while (RVar19 < pRVar3->max);
              }
              local_500 = (ulong)(iVar4 + 1);
            } while (iVar4 != (int)local_4d0);
          }
        }
        else {
          pRVar3 = ref_grid->cell[0];
          if (pRVar3->max < 1) {
            uVar5 = 0x80000000;
            local_500 = 0x7fffffff;
          }
          else {
            RVar19 = 0;
            uVar5 = 0x80000000;
            local_500 = 0x7fffffff;
            do {
              RVar6 = ref_cell_nodes(pRVar3,RVar19,(REF_INT *)&local_438);
              if (RVar6 == 0) {
                uVar22 = *(uint *)((long)&local_438 + (long)pRVar3->node_per * 4);
                if ((int)uVar22 <= (int)local_500) {
                  local_500 = (ulong)uVar22;
                }
                if ((int)uVar5 <= (int)uVar22) {
                  uVar5 = uVar22;
                }
              }
              RVar19 = RVar19 + 1;
            } while (RVar19 < pRVar3->max);
          }
          fprintf(pFVar11,"NMARK= %d\n",(ulong)((uVar5 - (int)local_500) + 1));
          if ((int)local_500 <= (int)uVar5) {
            local_4d0 = (void *)CONCAT44(local_4d0._4_4_,uVar5);
            do {
              pRVar3 = ref_grid->cell[0];
              uVar5 = 0;
              iVar4 = (int)local_500;
              if (0 < pRVar3->max) {
                iVar25 = pRVar3->node_per;
                uVar5 = 0;
                iVar15 = 0;
                do {
                  RVar6 = ref_cell_nodes(pRVar3,iVar15,(REF_INT *)&local_4c8);
                  if (RVar6 == 0) {
                    uVar5 = uVar5 + (*(int *)((long)&local_4c8 + (long)iVar25 * 4) == iVar4);
                  }
                  iVar15 = iVar15 + 1;
                } while (iVar15 < pRVar3->max);
              }
              fprintf(pFVar11,"MARKER_TAG= %d\n",local_500);
              fprintf(pFVar11,"MARKER_ELEMS= %d\n",(ulong)uVar5);
              pRVar3 = ref_grid->cell[0];
              if (0 < pRVar3->max) {
                uVar5 = pRVar3->node_per;
                iVar25 = 0;
                do {
                  RVar6 = ref_cell_nodes(pRVar3,iVar25,(REF_INT *)&local_4c8);
                  if ((RVar6 == 0) && (*(int *)((long)&local_4c8 + (long)(int)uVar5 * 4) == iVar4))
                  {
                    fputc(0x33,pFVar11);
                    if (0 < (int)uVar5) {
                      uVar27 = 0;
                      do {
                        fprintf(pFVar11," %d",
                                (ulong)(uint)local_4f0[*(int *)((long)&local_4c8 + uVar27 * 4)]);
                        uVar27 = uVar27 + 1;
                      } while (uVar5 != uVar27);
                    }
                    fputc(10,pFVar11);
                  }
                  iVar25 = iVar25 + 1;
                } while (iVar25 < pRVar3->max);
              }
              local_500 = (ulong)(iVar4 + 1);
            } while (iVar4 != (int)local_4d0);
          }
        }
        __ptr = local_4f0;
        if (local_4d8 != (REF_DICT)0x0) {
          free(local_4d8);
          __ptr = local_4f0;
        }
        goto LAB_00174bf7;
      }
      pcVar16 = "compact";
      uVar14 = 0x4e2;
      uVar27 = (ulong)uVar5;
LAB_00175ac4:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
             uVar14,"ref_export_su2",uVar27,pcVar16);
    }
    pcVar16 = "su2 export failed";
    uVar14 = 0xaac;
  }
LAB_001751c3:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",uVar14,
         "ref_export_by_extension",(ulong)uVar5,pcVar16);
  return uVar5;
LAB_00175818:
  RVar19 = RVar19 + 1;
  if (pRVar3->max <= RVar19) goto LAB_00175821;
  goto LAB_001757a4;
}

Assistant:

REF_FCN REF_STATUS ref_export_by_extension(REF_GRID ref_grid,
                                           const char *filename) {
  size_t end_of_string;

  end_of_string = strlen(filename);

  if (strcmp(&filename[end_of_string - 4], ".vtk") == 0) {
    RSS(ref_export_vtk(ref_grid, filename), "vtk export failed");
  } else if (strcmp(&filename[end_of_string - 2], ".c") == 0) {
    RSS(ref_export_c(ref_grid, filename), "C export failed");
  } else if (strcmp(&filename[end_of_string - 4], ".tec") == 0) {
    RSS(ref_export_tec(ref_grid, filename), "tec export failed");
  } else if (strcmp(&filename[end_of_string - 4], ".plt") == 0) {
    RSS(ref_gather_by_extension(ref_grid, filename), "plt gather failed");
  } else if (strcmp(&filename[end_of_string - 4], ".eps") == 0) {
    RSS(ref_export_eps(ref_grid, filename), "eps export failed");
  } else if (strcmp(&filename[end_of_string - 4], ".pdf") == 0) {
    RSS(ref_export_pdf(ref_grid, filename), "pdf export failed");
  } else if (strcmp(&filename[end_of_string - 4], ".su2") == 0) {
    RSS(ref_export_su2(ref_grid, filename), "su2 export failed");
  } else if (strcmp(&filename[end_of_string - 10], ".lb8.ugrid") == 0) {
    RSS(ref_export_bin_ugrid(ref_grid, filename, REF_FALSE, REF_FALSE),
        "lb8.ugrid export failed");
  } else if (strcmp(&filename[end_of_string - 9], ".b8.ugrid") == 0) {
    RSS(ref_export_bin_ugrid(ref_grid, filename, REF_TRUE, REF_FALSE),
        "b8.ugrid export failed");
  } else if (strcmp(&filename[end_of_string - 11], ".lb8l.ugrid") == 0) {
    RSS(ref_export_bin_ugrid(ref_grid, filename, REF_FALSE, REF_TRUE),
        "lb8l.ugrid export failed");
  } else if (strcmp(&filename[end_of_string - 10], ".b8l.ugrid") == 0) {
    RSS(ref_export_bin_ugrid(ref_grid, filename, REF_TRUE, REF_TRUE),
        "b8l.ugrid export failed");
  } else if (strcmp(&filename[end_of_string - 12], ".lb8.ugrid64") == 0) {
    RSS(ref_export_bin_ugrid(ref_grid, filename, REF_FALSE, REF_TRUE),
        "lb8.ugrid64 export failed");
  } else if (strcmp(&filename[end_of_string - 11], ".b8.ugrid64") == 0) {
    RSS(ref_export_bin_ugrid(ref_grid, filename, REF_TRUE, REF_TRUE),
        "b8.ugrid64 export failed");
  } else if (strcmp(&filename[end_of_string - 6], ".ugrid") == 0) {
    RSS(ref_export_ugrid(ref_grid, filename), "ugrid export failed");
  } else if (strcmp(&filename[end_of_string - 5], ".grid") == 0) {
    RSS(ref_export_i_like_cfd_grid(ref_grid, filename), "grid export failed");
  } else if (strcmp(&filename[end_of_string - 5], ".poly") == 0) {
    RSS(ref_export_poly(ref_grid, filename), "poly export failed");
  } else if (strcmp(&filename[end_of_string - 6], ".smesh") == 0) {
    RSS(ref_export_smesh(ref_grid, filename), "smesh export failed");
  } else if (strcmp(&filename[end_of_string - 6], ".fgrid") == 0) {
    RSS(ref_export_fgrid(ref_grid, filename), "fgrid export failed");
  } else if (strcmp(&filename[end_of_string - 5], ".html") == 0) {
    RSS(ref_export_html(ref_grid, filename), "html export failed");
  } else if (strcmp(&filename[end_of_string - 6], ".meshb") == 0) {
    RSS(ref_export_meshb(ref_grid, filename), "meshb export failed");
  } else if (strcmp(&filename[end_of_string - 9], "-bamg.msh") == 0) {
    RSS(ref_export_bamg_msh(ref_grid, filename), "bamg msh export failed");
  } else if (strcmp(&filename[end_of_string - 4], ".msh") == 0) {
    RSS(ref_export_msh(ref_grid, filename), "msh export failed");
  } else if (strcmp(&filename[end_of_string - 5], ".msh2") == 0) {
    RSS(ref_export_msh2(ref_grid, filename), "msh2 export failed");
  } else if (strcmp(&filename[end_of_string - 4], ".tri") == 0) {
    RSS(ref_export_tri(ref_grid, filename), "tri export failed");
  } else {
    RSS(ref_gather_by_extension(ref_grid, filename), "export via gather");
  }

  return REF_SUCCESS;
}